

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ShapeRange * __thiscall
CoreML::ShapeRange::operator+(ShapeRange *__return_storage_ptr__,ShapeRange *this,size_t val)

{
  RangeValue RVar1;
  ShapeRange *out;
  RangeValue local_38;
  RangeValue local_28;
  size_t local_18;
  size_t val_local;
  ShapeRange *this_local;
  
  local_18 = val;
  val_local = (size_t)this;
  ShapeRange(__return_storage_ptr__);
  RVar1 = RangeValue::operator+(&this->_minimum,local_18);
  local_28._val = RVar1._val;
  local_28._isUnbound = RVar1._isUnbound;
  setLower(__return_storage_ptr__,&local_28);
  RVar1 = RangeValue::operator+(&this->_maximum,local_18);
  local_38._val = RVar1._val;
  local_38._isUnbound = RVar1._isUnbound;
  setUpper(__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

ShapeRange ShapeRange::operator+ (size_t val) const {
    ShapeRange out;
    out.setLower(_minimum + val);
    out.setUpper(_maximum + val);
    return out;
}